

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chillout.cpp
# Opt level: O0

int __thiscall Debug::Chillout::init(Chillout *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  PosixCrashHandler *this_00;
  string *in_RDX;
  PosixCrashHandler *handler;
  string_t *pathToDumpsDir_local;
  string_t *appName_local;
  Chillout *this_local;
  
  LOCK();
  iVar1 = (this->m_InitCounter).super___atomic_base<int>._M_i;
  (this->m_InitCounter).super___atomic_base<int>._M_i =
       (this->m_InitCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  iVar2 = 0;
  if (iVar1 == 0) {
    this_00 = PosixCrashHandler::getInstance();
    PosixCrashHandler::setup(this_00,(string *)ctx,in_RDX);
    iVar2 = extraout_EAX;
  }
  return iVar2;
}

Assistant:

void Chillout::init(const string_t &appName, const string_t &pathToDumpsDir) {
        if (0 == m_InitCounter.fetch_add(1)) {
#ifdef _WIN32
            WindowsCrashHandler &handler = WindowsCrashHandler::getInstance();
#else
            PosixCrashHandler &handler = PosixCrashHandler::getInstance();
#endif
            handler.setup(appName, pathToDumpsDir);
        }
    }